

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O3

_Bool effect_handler_DISENCHANT(effect_handler_context_t_conflict *context)

{
  ulong uVar1;
  player_upkeep *ppVar2;
  player *p;
  _Bool _Var3;
  char cVar4;
  uint32_t uVar5;
  object *obj;
  ushort uVar6;
  char *pcVar7;
  wchar_t slot;
  int iVar8;
  uint32_t uVar9;
  long lVar10;
  wchar_t slot_00;
  char o_name [80];
  char acStack_88 [88];
  
  slot = L'\xffffffff';
  if ((player->body).count != 0) {
    uVar9 = 0;
    slot_00 = L'\0';
    do {
      _Var3 = slot_type_is(player,slot_00,L'\x03');
      if ((!_Var3) && (_Var3 = slot_type_is(player,slot_00,L'\x04'), !_Var3)) {
        _Var3 = slot_type_is(player,slot_00,L'\x05');
        uVar9 = uVar9 + !_Var3;
      }
      slot_00 = slot_00 + L'\x01';
      uVar6 = (player->body).count;
    } while ((uint)slot_00 < (uint)uVar6);
    if ((uint)uVar6 != L'\0') {
      iVar8 = uVar6 + 1;
      do {
        slot = iVar8 + L'\xfffffffe';
        _Var3 = slot_type_is(player,slot,L'\x03');
        if (((!_Var3) && (_Var3 = slot_type_is(player,slot,L'\x04'), !_Var3)) &&
           (_Var3 = slot_type_is(player,slot,L'\x05'), !_Var3)) {
          uVar5 = Rand_div(uVar9);
          if (uVar5 == 0) goto LAB_0013f794;
          uVar9 = uVar9 - 1;
        }
        iVar8 = iVar8 + -1;
      } while (1 < iVar8);
      slot = L'\xffffffff';
    }
  }
LAB_0013f794:
  p = player;
  context->ident = true;
  obj = slot_object(p,slot);
  if ((obj != (object *)0x0) && (((0 < obj->to_h || (0 < obj->to_d)) || (0 < obj->to_a)))) {
    object_desc(acStack_88,0x50,obj,0,player);
    if ((obj->artifact == (artifact *)0x0) || (uVar9 = Rand_div(100), 0x3b < (int)uVar9)) {
      _Var3 = slot_type_is(player,slot,L'\x01');
      if ((_Var3) || (_Var3 = slot_type_is(player,slot,L'\x02'), _Var3)) {
        uVar6 = obj->to_h;
        if (0 < (short)uVar6) {
          uVar6 = uVar6 - 1;
          obj->to_h = uVar6;
          if (5 < uVar6) {
            uVar9 = Rand_div(100);
            uVar6 = obj->to_h;
            if ((int)uVar9 < 0x14) {
              uVar6 = uVar6 - 1;
              obj->to_h = uVar6;
            }
          }
        }
        obj->known->to_h = uVar6;
        uVar6 = obj->to_d;
        lVar10 = 0x4a;
        if (0 < (short)uVar6) {
          uVar6 = uVar6 - 1;
          obj->to_d = uVar6;
          if (5 < uVar6) {
            uVar9 = Rand_div(100);
            uVar6 = obj->to_d;
            if ((int)uVar9 < 0x14) {
              uVar6 = uVar6 - 1;
              obj->to_d = uVar6;
            }
          }
        }
      }
      else {
        uVar6 = obj->to_a;
        if (0 < (short)uVar6) {
          uVar6 = uVar6 - 1;
          obj->to_a = uVar6;
          if (5 < uVar6) {
            uVar9 = Rand_div(100);
            uVar6 = obj->to_a;
            if ((int)uVar9 < 0x14) {
              uVar6 = uVar6 - 1;
              obj->to_a = uVar6;
            }
          }
        }
        lVar10 = 0x46;
      }
      *(ushort *)(obj->known->flags + lVar10 + -0x4c) = uVar6;
      cVar4 = gear_to_label(player,obj);
      pcVar7 = "were";
      if (obj->number == '\x01') {
        pcVar7 = "was";
      }
      msg("Your %s (%c) %s disenchanted!",acStack_88,(ulong)(uint)(int)cVar4,pcVar7);
      ppVar2 = player->upkeep;
      uVar1._0_4_ = ppVar2->update;
      uVar1._4_4_ = ppVar2->redraw;
      ppVar2->update = (int)(uVar1 | 0x4000000000001);
      ppVar2->redraw = (int)((uVar1 | 0x4000000000001) >> 0x20);
    }
    else {
      cVar4 = gear_to_label(player,obj);
      pcVar7 = "";
      if (obj->number == '\x01') {
        pcVar7 = "s";
      }
      msg("Your %s (%c) resist%s disenchantment!",acStack_88,(ulong)(uint)(int)cVar4,pcVar7);
    }
  }
  return true;
}

Assistant:

bool effect_handler_DISENCHANT(effect_handler_context_t *context)
{
	int i, count = 0;
	struct object *obj;
	char o_name[80];

	/* Count slots */
	for (i = 0; i < player->body.count; i++) {
		/* Ignore rings, amulets and lights */
		if (slot_type_is(player, i, EQUIP_RING)) continue;
		if (slot_type_is(player, i, EQUIP_AMULET)) continue;
		if (slot_type_is(player, i, EQUIP_LIGHT)) continue;

		/* Count disenchantable slots */
		count++;
	}

	/* Pick one at random */
	for (i = player->body.count - 1; i >= 0; i--) {
		/* Ignore rings, amulets and lights */
		if (slot_type_is(player, i, EQUIP_RING)) continue;
		if (slot_type_is(player, i, EQUIP_AMULET)) continue;
		if (slot_type_is(player, i, EQUIP_LIGHT)) continue;

		if (one_in_(count--)) break;
	}

	/* Notice */
	context->ident = true;

	/* Get the item */
	obj = slot_object(player, i);

	/* No item, nothing happens */
	if (!obj) return true;

	/* Nothing to disenchant */
	if ((obj->to_h <= 0) && (obj->to_d <= 0) && (obj->to_a <= 0))
		return true;

	/* Describe the object */
	object_desc(o_name, sizeof(o_name), obj, ODESC_BASE, player);

	/* Artifacts have a 60% chance to resist */
	if (obj->artifact && (randint0(100) < 60)) {
		/* Message */
		msg("Your %s (%c) resist%s disenchantment!", o_name,
			gear_to_label(player, obj),
			((obj->number != 1) ? "" : "s"));

		return true;
	}

	/* Apply disenchantment, depending on which kind of equipment */
	if (slot_type_is(player, i, EQUIP_WEAPON)
			|| slot_type_is(player, i, EQUIP_BOW)) {
		/* Disenchant to-hit */
		if (obj->to_h > 0) obj->to_h--;
		if ((obj->to_h > 5) && (randint0(100) < 20)) obj->to_h--;
		obj->known->to_h = obj->to_h;

		/* Disenchant to-dam */
		if (obj->to_d > 0) obj->to_d--;
		if ((obj->to_d > 5) && (randint0(100) < 20)) obj->to_d--;
		obj->known->to_d = obj->to_d;
	} else {
		/* Disenchant to-ac */
		if (obj->to_a > 0) obj->to_a--;
		if ((obj->to_a > 5) && (randint0(100) < 20)) obj->to_a--;
		obj->known->to_a = obj->to_a;
	}

	/* Message */
	msg("Your %s (%c) %s disenchanted!", o_name,
		gear_to_label(player, obj),
		((obj->number != 1) ? "were" : "was"));

	/* Recalculate bonuses */
	player->upkeep->update |= (PU_BONUS);

	/* Window stuff */
	player->upkeep->redraw |= (PR_EQUIP);

	return true;
}